

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

bool __thiscall trun::Process::ExecuteAndWait(Process *this)

{
  Process_Unix *this_00;
  pointer pcVar1;
  bool bVar2;
  string local_40;
  
  this_00 = &this->process;
  bVar2 = Process_Unix::PrepareFileDescriptors(this_00);
  if (((bVar2) && (bVar2 = Process_Unix::CreatePipes(this_00), bVar2)) &&
     (bVar2 = Process_Unix::Duplicate(this_00), bVar2)) {
    pcVar1 = (this->command)._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + (this->command)._M_string_length);
    bVar2 = Process_Unix::SpawnAndLoop
                      (this_00,&local_40,&this->arguments,&this->super_ProcessCallbackBase);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return bVar2;
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    return bVar2;
  }
  return false;
}

Assistant:

bool Process::ExecuteAndWait() {
	if (!process.PrepareFileDescriptors()) return false;
	if (!process.CreatePipes()) return false;
	if (!process.SetNonBlocking()) return false;
	if (!process.Duplicate()) return false;
	return process.SpawnAndLoop(command, arguments, dynamic_cast<ProcessCallbackBase *>(this));
}